

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testmap.cpp
# Opt level: O0

Am_Wrapper * map_fill_proc(Am_Object *self)

{
  int iVar1;
  Am_Value *this;
  int rank;
  Am_Object *self_local;
  
  this = (Am_Value *)Am_Object::Get((ushort)self,0x85);
  iVar1 = Am_Value::operator_cast_to_int(this);
  switch(iVar1) {
  case 0:
    self_local = (Am_Object *)Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Red);
    break;
  case 1:
    self_local = (Am_Object *)Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Blue);
    break;
  case 2:
    self_local = (Am_Object *)Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Green);
    break;
  case 3:
    self_local = (Am_Object *)Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Orange);
    break;
  case 4:
    self_local = (Am_Object *)Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Purple);
    break;
  case 5:
    self_local = (Am_Object *)Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Cyan);
    break;
  case 6:
    self_local = (Am_Object *)Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Yellow);
    break;
  default:
    self_local = (Am_Object *)Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_White);
  }
  return (Am_Wrapper *)self_local;
}

Assistant:

Am_Define_Style_Formula(map_fill)
{
  int rank = self.Get(Am_RANK);
  switch (rank) {
  case 0:
    return Am_Red;
  case 1:
    return Am_Blue;
  case 2:
    return Am_Green;
  case 3:
    return Am_Orange;
  case 4:
    return Am_Purple;
  case 5:
    return Am_Cyan;
  case 6:
    return Am_Yellow;
  default:
    return Am_White;
  }
}